

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

ParameterizedTestSuiteInfo<google::protobuf::compiler::python::(anonymous_namespace)::PythonGeneratorTest>
* __thiscall
testing::internal::ParameterizedTestSuiteRegistry::
GetTestSuitePatternHolder<google::protobuf::compiler::python::(anonymous_namespace)::PythonGeneratorTest>
          (ParameterizedTestSuiteRegistry *this,string *test_suite_name,CodeLocation *code_location)

{
  pointer pcVar1;
  size_type sVar2;
  bool bVar3;
  int iVar4;
  iterator iVar5;
  undefined4 extraout_var;
  long lVar6;
  ParameterizedTestSuiteInfo<google::protobuf::compiler::python::(anonymous_namespace)::PythonGeneratorTest>
  *pPVar7;
  ulong *puVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  ParameterizedTestSuiteInfo<google::protobuf::compiler::python::(anonymous_namespace)::PythonGeneratorTest>
  *local_80;
  pointer local_78;
  size_type local_70;
  char local_68;
  undefined7 uStack_67;
  undefined8 uStack_60;
  ulong *local_58;
  undefined8 local_50;
  ulong local_48;
  undefined8 uStack_40;
  int local_38;
  
  iVar5 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->suite_name_to_info_index_)._M_h,test_suite_name);
  if (iVar5.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
      ._M_cur == (__node_type *)0x0) {
    pPVar7 = (ParameterizedTestSuiteInfo<google::protobuf::compiler::python::(anonymous_namespace)::PythonGeneratorTest>
              *)operator_new(0x80);
    local_78 = &local_68;
    pcVar1 = (test_suite_name->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,pcVar1,pcVar1 + test_suite_name->_M_string_length);
    local_58 = &local_48;
    puVar8 = (ulong *)(code_location->file)._M_dataplus._M_p;
    paVar9 = &(code_location->file).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8 == paVar9) {
      local_48 = paVar9->_M_allocated_capacity;
      uStack_40 = *(undefined8 *)((long)&(code_location->file).field_2 + 8);
      puVar8 = local_58;
    }
    else {
      local_48 = paVar9->_M_allocated_capacity;
    }
    sVar2 = (code_location->file)._M_string_length;
    (code_location->file)._M_dataplus._M_p = (pointer)paVar9;
    (code_location->file)._M_string_length = 0;
    (code_location->file).field_2._M_local_buf[0] = '\0';
    local_38 = code_location->line;
    (pPVar7->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase =
         (_func_int **)&PTR__ParameterizedTestSuiteInfo_018e1768;
    paVar9 = &(pPVar7->test_suite_name_).field_2;
    (pPVar7->test_suite_name_)._M_dataplus._M_p = (pointer)paVar9;
    if (local_78 == &local_68) {
      paVar9->_M_allocated_capacity = CONCAT71(uStack_67,local_68);
      *(undefined8 *)((long)&(pPVar7->test_suite_name_).field_2 + 8) = uStack_60;
    }
    else {
      (pPVar7->test_suite_name_)._M_dataplus._M_p = local_78;
      (pPVar7->test_suite_name_).field_2._M_allocated_capacity = CONCAT71(uStack_67,local_68);
    }
    (pPVar7->test_suite_name_)._M_string_length = local_70;
    local_70 = 0;
    local_68 = '\0';
    paVar9 = &(pPVar7->code_location_).file.field_2;
    (pPVar7->code_location_).file._M_dataplus._M_p = (pointer)paVar9;
    if (puVar8 == local_58) {
      paVar9->_M_allocated_capacity = local_48;
      *(undefined8 *)((long)&(pPVar7->code_location_).file.field_2 + 8) = uStack_40;
    }
    else {
      (pPVar7->code_location_).file._M_dataplus._M_p = (pointer)puVar8;
      (pPVar7->code_location_).file.field_2._M_allocated_capacity = local_48;
    }
    (pPVar7->code_location_).file._M_string_length = sVar2;
    local_50 = 0;
    local_48 = local_48 & 0xffffffffffffff00;
    (pPVar7->code_location_).line = local_38;
    (pPVar7->tests_).
    super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::compiler::python::(anonymous_namespace)::PythonGeneratorTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::compiler::python::(anonymous_namespace)::PythonGeneratorTest>::TestInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pPVar7->tests_).
    super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::compiler::python::(anonymous_namespace)::PythonGeneratorTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::compiler::python::(anonymous_namespace)::PythonGeneratorTest>::TestInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pPVar7->tests_).
    super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::compiler::python::(anonymous_namespace)::PythonGeneratorTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::compiler::python::(anonymous_namespace)::PythonGeneratorTest>::TestInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pPVar7->instantiations_).
    super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::compiler::python::(anonymous_namespace)::PythonGeneratorTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::compiler::python::(anonymous_namespace)::PythonGeneratorTest>::InstantiationInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pPVar7->instantiations_).
    super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::compiler::python::(anonymous_namespace)::PythonGeneratorTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::compiler::python::(anonymous_namespace)::PythonGeneratorTest>::InstantiationInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pPVar7->instantiations_).
    super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::compiler::python::(anonymous_namespace)::PythonGeneratorTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::compiler::python::(anonymous_namespace)::PythonGeneratorTest>::InstantiationInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_80 = (ParameterizedTestSuiteInfo<google::protobuf::compiler::python::(anonymous_namespace)::PythonGeneratorTest>
                *)((long)(this->test_suite_infos_).
                         super__Vector_base<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->test_suite_infos_).
                         super__Vector_base<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3);
    local_78 = &local_68;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::__cxx11::string,unsigned_long>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&this->suite_name_to_info_index_,test_suite_name,&local_80);
    local_80 = pPVar7;
    std::
    vector<testing::internal::ParameterizedTestSuiteInfoBase*,std::allocator<testing::internal::ParameterizedTestSuiteInfoBase*>>
    ::emplace_back<testing::internal::ParameterizedTestSuiteInfoBase*>
              ((vector<testing::internal::ParameterizedTestSuiteInfoBase*,std::allocator<testing::internal::ParameterizedTestSuiteInfoBase*>>
                *)this,(ParameterizedTestSuiteInfoBase **)&local_80);
  }
  else {
    pPVar7 = (ParameterizedTestSuiteInfo<google::protobuf::compiler::python::(anonymous_namespace)::PythonGeneratorTest>
              *)(this->test_suite_infos_).
                super__Vector_base<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
                ._M_impl.super__Vector_impl_data._M_start
                [*(long *)((long)iVar5.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                 ._M_cur + 0x28)];
    iVar4 = (*(pPVar7->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase[3]
            )(pPVar7);
    if ((undefined1 *)CONCAT44(extraout_var,iVar4) !=
        &TypeIdHelper<google::protobuf::compiler::python::(anonymous_namespace)::PythonGeneratorTest>
         ::dummy_) {
      ReportInvalidTestSuiteType((test_suite_name->_M_dataplus)._M_p,code_location);
      posix::Abort();
    }
    lVar6 = __dynamic_cast(pPVar7,&ParameterizedTestSuiteInfoBase::typeinfo,
                           &ParameterizedTestSuiteInfo<google::protobuf::compiler::python::(anonymous_namespace)::PythonGeneratorTest>
                            ::typeinfo,0);
    bVar3 = IsTrue(lVar6 != 0);
    if (!bVar3) {
      GTestLog::GTestLog((GTestLog *)&local_80,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/googletest-src/googletest/include/gtest/internal/gtest-port.h"
                         ,0x4aa);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "Condition base == nullptr || dynamic_cast<Derived*>(base) != nullptr failed. ",
                 0x4d);
      GTestLog::~GTestLog((GTestLog *)&local_80);
    }
  }
  return pPVar7;
}

Assistant:

ParameterizedTestSuiteInfo<TestSuite>* GetTestSuitePatternHolder(
      std::string test_suite_name, CodeLocation code_location) {
    ParameterizedTestSuiteInfo<TestSuite>* typed_test_info = nullptr;

    auto item_it = suite_name_to_info_index_.find(test_suite_name);
    if (item_it != suite_name_to_info_index_.end()) {
      auto* test_suite_info = test_suite_infos_[item_it->second];
      if (test_suite_info->GetTestSuiteTypeId() != GetTypeId<TestSuite>()) {
        // Complain about incorrect usage of Google Test facilities
        // and terminate the program since we cannot guaranty correct
        // test suite setup and tear-down in this case.
        ReportInvalidTestSuiteType(test_suite_name.c_str(), code_location);
        posix::Abort();
      } else {
        // At this point we are sure that the object we found is of the same
        // type we are looking for, so we downcast it to that type
        // without further checks.
        typed_test_info =
            CheckedDowncastToActualType<ParameterizedTestSuiteInfo<TestSuite>>(
                test_suite_info);
      }
    }
    if (typed_test_info == nullptr) {
      typed_test_info = new ParameterizedTestSuiteInfo<TestSuite>(
          test_suite_name, std::move(code_location));
      suite_name_to_info_index_.emplace(std::move(test_suite_name),
                                        test_suite_infos_.size());
      test_suite_infos_.push_back(typed_test_info);
    }
    return typed_test_info;
  }